

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SscReader::EndStep(SscReader *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  element_type *peVar4;
  long in_RDI;
  ScopedTimer __var281;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int local_f8;
  allocator *__val;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [64];
  
  if (EndStep()::__var81 == '\0') {
    iVar1 = __cxa_guard_acquire(&EndStep()::__var81);
    if (iVar1 != 0) {
      uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,"virtual void adios2::core::engine::SscReader::EndStep()",0x51);
      EndStep::__var81 = (void *)ps_timer_create_(uVar3);
      __cxa_guard_release(&EndStep()::__var81);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  __val = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Engine",__val);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"SscReader",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"EndStep",&local_91);
  CurrentStep((SscReader *)0x1d8423);
  std::__cxx11::to_string((unsigned_long)__val);
  if (*(int *)(in_RDI + 0xc0) < 10) {
    local_f8 = 0;
  }
  else {
    local_f8 = adios2::helper::Comm::Rank();
  }
  iVar2 = adios2::helper::Comm::Rank();
  iVar1 = *(int *)(in_RDI + 0xc0);
  adios2::helper::Log(local_40,local_68,local_90,local_b8,local_f8,iVar2,5,iVar1,INFO);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  peVar4 = std::
           __shared_ptr_access<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d8540);
  (*peVar4->_vptr_SscReaderBase[5])(peVar4,(ulong)(*(byte *)(in_RDI + 0x83) & 1));
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffef4,iVar1));
  return;
}

Assistant:

void SscReader::EndStep()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    helper::Log("Engine", "SscReader", "EndStep", std::to_string(CurrentStep()),
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    return m_EngineInstance->EndStep(m_ReaderSelectionsLocked);
}